

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  int iVar1;
  anon_class_40_5_d6c92a71 f;
  SquareMatrix<double> local_68;
  anon_class_40_5_d6c92a71 local_58;
  
  iVar1 = (*(this->super_QObject<double>)._vptr_QObject[3])();
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_68,this);
  lambda_QGate1<double>(&local_58,op,&local_68,*(double **)vector);
  if ((_Head_base<0UL,_double_*,_false>)
      local_68.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_68.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_68.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  apply2<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_58);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }